

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O2

void __thiscall icu_63::TZGNCore::loadStrings(TZGNCore *this,UnicodeString *tzCanonicalID)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  UnicodeString *mzID;
  long lVar3;
  UErrorCode status;
  UnicodeString mzGenName;
  UnicodeString goldenID;
  int local_c4;
  long *local_c0;
  char *local_b8;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  getGenericLocationName(this,tzCanonicalID);
  local_c4 = 0;
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar2 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[6])
                    (this->fTimeZoneNames,tzCanonicalID);
  local_c0 = (long *)CONCAT44(extraout_var,iVar2);
  local_b8 = this->fTargetRegion;
  while( true ) {
    mzID = (UnicodeString *)(**(code **)(*local_c0 + 0x38))(local_c0,&local_c4);
    if ((mzID == (UnicodeString *)0x0) || (0 < local_c4)) break;
    (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
              (this->fTimeZoneNames,mzID,local_b8,&local_70);
    UVar1 = UnicodeString::operator!=(tzCanonicalID,&local_70);
    if (UVar1 != '\0') {
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
        (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[9])
                  (this->fTimeZoneNames,mzID,(ulong)*(uint *)((long)&DAT_002e1e50 + lVar3),&local_b0
                  );
        if (0x1f < (ushort)local_b0.fUnion.fStackFields.fLengthAndFlags) {
          getPartialLocationName(this,tzCanonicalID,mzID,lVar3 == 0,&local_b0);
        }
      }
    }
  }
  (**(code **)(*local_c0 + 8))();
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void
TZGNCore::loadStrings(const UnicodeString& tzCanonicalID) {
    // load the generic location name
    getGenericLocationName(tzCanonicalID);

    // partial location names
    UErrorCode status = U_ZERO_ERROR;

    const UnicodeString *mzID;
    UnicodeString goldenID;
    UnicodeString mzGenName;
    UTimeZoneNameType genNonLocTypes[] = {
        UTZNM_LONG_GENERIC, UTZNM_SHORT_GENERIC,
        UTZNM_UNKNOWN /*terminator*/
    };

    StringEnumeration *mzIDs = fTimeZoneNames->getAvailableMetaZoneIDs(tzCanonicalID, status);
    while ((mzID = mzIDs->snext(status)) != NULL) {
        if (U_FAILURE(status)) {
            break;
        }
        // if this time zone is not the golden zone of the meta zone,
        // partial location name (such as "PT (Los Angeles)") might be
        // available.
        fTimeZoneNames->getReferenceZoneID(*mzID, fTargetRegion, goldenID);
        if (tzCanonicalID != goldenID) {
            for (int32_t i = 0; genNonLocTypes[i] != UTZNM_UNKNOWN; i++) {
                fTimeZoneNames->getMetaZoneDisplayName(*mzID, genNonLocTypes[i], mzGenName);
                if (!mzGenName.isEmpty()) {
                    // getPartialLocationName formats a name and put it into the trie
                    getPartialLocationName(tzCanonicalID, *mzID,
                        (genNonLocTypes[i] == UTZNM_LONG_GENERIC), mzGenName);
                }
            }
        }
    }
    if (mzIDs != NULL) {
        delete mzIDs;
    }
}